

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

size_type __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::erase(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
        *this,key_type *key)

{
  iterator pos;
  iterator it;
  iterator local_28;
  
  find(&it,this,key);
  if (it.it_.node_ != (Node *)0x0) {
    pos.it_.m_ = it.it_.m_;
    pos.it_.node_ = it.it_.node_;
    pos.it_.bucket_index_ = it.it_.bucket_index_;
    erase(&local_28,this,pos);
  }
  return (ulong)(it.it_.node_ != (Node *)0x0);
}

Assistant:

size_type erase(const key_type& key) {
    iterator it = find(key);
    if (it == end()) {
      return 0;
    } else {
      erase(it);
      return 1;
    }
  }